

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s1chord_angle.cc
# Opt level: O0

S1ChordAngle operator+(S1ChordAngle a,S1ChordAngle b)

{
  bool bVar1;
  ostream *poVar2;
  double *pdVar3;
  double dVar4;
  double dVar5;
  double local_90;
  double local_88;
  double y;
  double x;
  double b2;
  double a2;
  S2LogMessage local_60;
  S2LogMessageVoidify local_4d [20];
  byte local_39;
  S2LogMessage local_38;
  S2LogMessageVoidify local_21;
  S1ChordAngle local_20;
  S1ChordAngle b_local;
  S1ChordAngle a_local;
  
  local_20.length2_ = b.length2_;
  b_local = a;
  bVar1 = S1ChordAngle::is_special(&b_local);
  local_39 = 0;
  if (bVar1) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_38,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s1chord_angle.cc"
               ,99,kFatal,(ostream *)&std::cerr);
    local_39 = 1;
    poVar2 = S2LogMessage::stream(&local_38);
    poVar2 = std::operator<<(poVar2,"Check failed: !a.is_special() ");
    S2LogMessageVoidify::operator&(&local_21,poVar2);
  }
  if ((local_39 & 1) != 0) {
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_38);
  }
  bVar1 = S1ChordAngle::is_special(&local_20);
  a2._7_1_ = 0;
  if (bVar1) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_60,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s1chord_angle.cc"
               ,100,kFatal,(ostream *)&std::cerr);
    a2._7_1_ = 1;
    poVar2 = S2LogMessage::stream(&local_60);
    poVar2 = std::operator<<(poVar2,"Check failed: !b.is_special() ");
    S2LogMessageVoidify::operator&(local_4d,poVar2);
  }
  if ((a2._7_1_ & 1) != 0) {
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_60);
  }
  b2 = S1ChordAngle::length2(&b_local);
  x = S1ChordAngle::length2(&local_20);
  if ((x != 0.0) || (NAN(x))) {
    if (b2 + x < 4.0) {
      y = b2 * (1.0 - x * 0.25);
      local_88 = x * (1.0 - b2 * 0.25);
      dVar4 = y + local_88;
      dVar5 = sqrt(y * local_88);
      local_90 = dVar4 + dVar5 * 2.0;
      pdVar3 = std::min<double>((double *)&kMaxLength2,&local_90);
      S1ChordAngle::S1ChordAngle(&a_local,*pdVar3);
    }
    else {
      a_local = S1ChordAngle::Straight();
    }
  }
  else {
    a_local = b_local;
  }
  return (S1ChordAngle)a_local.length2_;
}

Assistant:

S1ChordAngle operator+(S1ChordAngle a, S1ChordAngle b) {
  // Note that this method is much more efficient than converting the chord
  // angles to S1Angles and adding those.  It requires only one square root
  // plus a few additions and multiplications.
  S2_DCHECK(!a.is_special());
  S2_DCHECK(!b.is_special());

  // Optimization for the common case where "b" is an error tolerance
  // parameter that happens to be set to zero.
  double a2 = a.length2(), b2 = b.length2();
  if (b2 == 0) return a;

  // Clamp the angle sum to at most 180 degrees.
  if (a2 + b2 >= kMaxLength2) return S1ChordAngle::Straight();

  // Let "a" and "b" be the (non-squared) chord lengths, and let c = a+b.
  // Let A, B, and C be the corresponding half-angles (a = 2*sin(A), etc).
  // Then the formula below can be derived from c = 2 * sin(A+B) and the
  // relationships   sin(A+B) = sin(A)*cos(B) + sin(B)*cos(A)
  //                 cos(X) = sqrt(1 - sin^2(X)) .

  double x = a2 * (1 - 0.25 * b2);  // is_valid() => non-negative
  double y = b2 * (1 - 0.25 * a2);  // is_valid() => non-negative
  return S1ChordAngle(min(kMaxLength2, x + y + 2 * sqrt(x * y)));
}